

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::StringUtilTest_IsEqualNoCase_Test::TestBody
          (StringUtilTest_IsEqualNoCase_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_2f8;
  AssertHelper local_2d8;
  Message local_2d0;
  string_view local_2c8;
  string_view local_2b8;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_270;
  Message local_268;
  string_view local_260;
  string_view local_250;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_208;
  Message local_200;
  string_view local_1f8;
  string_view local_1e8;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1a0;
  Message local_198;
  string_view local_190;
  string_view local_180;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_138;
  Message local_130;
  string_view local_128;
  string_view local_118;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_d0;
  Message local_c8;
  string_view local_c0;
  string_view local_b0;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_68 [3];
  Message local_50;
  string_view local_48;
  string_view local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  StringUtilTest_IsEqualNoCase_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"");
  local_21 = string_util::IsEqualNoCase(local_38,local_48);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"bssl::string_util::IsEqualNoCase(\"\", \"\")","false","true",
               in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(local_68,&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    ::std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,"mail.google.com");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c0,"maIL.GOoGlE.cOm");
  local_99 = string_util::IsEqualNoCase(local_b0,local_c0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_98,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail.google.com\", \"maIL.GOoGlE.cOm\")","false",
               "true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    ::std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,"MAil~-.google.cOm");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,"maIL~-.gOoGlE.CoM");
  local_101 = string_util::IsEqualNoCase(local_118,local_128);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_100,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"MAil~-.google.cOm\", \"maIL~-.gOoGlE.CoM\")",
               "false","true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    ::std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_180,anon_var_dwarf_274dd1);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,anon_var_dwarf_274ddb);
  local_169 = string_util::IsEqualNoCase(local_180,local_190);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_168,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail\\x80.google.com\", \"maIL\\x80.GOoGlE.cOm\")"
               ,"false","true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    ::std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1e8,anon_var_dwarf_274dfb);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f8,anon_var_dwarf_274e05);
  local_1d1 = string_util::IsEqualNoCase(local_1e8,local_1f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1d0,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail\\xFF.google.com\", \"maIL\\xFF.GOoGlE.cOm\")"
               ,"false","true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    ::std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_250,"mail.google.co");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_260,"maIL.GOoGlE.cOm");
  bVar1 = string_util::IsEqualNoCase(local_250,local_260);
  local_239 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_238,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail.google.co\", \"maIL.GOoGlE.cOm\")","true",
               "false",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    ::std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2b8,"mail.google.com");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c8,"maIL.GOoGlE.cO");
  bVar1 = string_util::IsEqualNoCase(local_2b8,local_2c8);
  local_2a1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f8,(internal *)local_2a0,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail.google.com\", \"maIL.GOoGlE.cO\")","true",
               "false",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    ::std::__cxx11::string::~string((string *)&local_2f8);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  return;
}

Assistant:

TEST(StringUtilTest, IsEqualNoCase) {
  EXPECT_TRUE(bssl::string_util::IsEqualNoCase("", ""));
  EXPECT_TRUE(
      bssl::string_util::IsEqualNoCase("mail.google.com", "maIL.GOoGlE.cOm"));
  EXPECT_TRUE(bssl::string_util::IsEqualNoCase("MAil~-.google.cOm",
                                               "maIL~-.gOoGlE.CoM"));
  EXPECT_TRUE(bssl::string_util::IsEqualNoCase("mail\x80.google.com",
                                               "maIL\x80.GOoGlE.cOm"));
  EXPECT_TRUE(bssl::string_util::IsEqualNoCase("mail\xFF.google.com",
                                               "maIL\xFF.GOoGlE.cOm"));
  EXPECT_FALSE(
      bssl::string_util::IsEqualNoCase("mail.google.co", "maIL.GOoGlE.cOm"));
  EXPECT_FALSE(
      bssl::string_util::IsEqualNoCase("mail.google.com", "maIL.GOoGlE.cO"));
}